

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsFunction.hpp
# Opt level: O0

void __thiscall
webfront::
JsFunction<webfront::BasicWF<webfront::networking::TCPNetworkingTS,webfront::fs::Multi<webfront::fs::NativeDebugFS,webfront::fs::IndexFS,webfront::fs::JasmineFS>>>
::operator()(JsFunction<webfront::BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::JasmineFS>_>_>
             *this,char (*ts) [12],int *ts_1)

{
  pointer __first;
  WebLink<webfront::networking::TCPNetworkingTS> *this_00;
  long in_RDI;
  FunctionCall *this_01;
  span<const_std::byte,_18446744073709551615UL> sVar1;
  Frame<webfront::networking::TCPNetworkingTS> frame;
  undefined8 in_stack_ffffffffffffff18;
  WebLinkId id;
  BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::JasmineFS>_>
  *in_stack_ffffffffffffff20;
  Frame<webfront::networking::TCPNetworkingTS> *in_stack_ffffffffffffff58;
  WebLink<webfront::networking::TCPNetworkingTS> *in_stack_ffffffffffffff60;
  Frame<webfront::networking::TCPNetworkingTS> *in_stack_ffffffffffffff70;
  char (*in_stack_ffffffffffffff78) [12];
  FunctionCall *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  FunctionCall *this_02;
  Frame<webfront::networking::TCPNetworkingTS> *this_03;
  __extent_storage<18446744073709551615UL> t;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffffb0;
  span<const_std::byte,_18446744073709551615UL> in_stack_ffffffffffffffb8;
  
  id = (WebLinkId)((ulong)in_stack_ffffffffffffff18 >> 0x30);
  this_01 = (FunctionCall *)(in_RDI + 0x30);
  msg::FunctionCall::setParametersCount(this_01,'\0');
  sVar1 = msg::MessageBase<webfront::msg::FunctionCall>::header
                    ((MessageBase<webfront::msg::FunctionCall> *)0x147066);
  this_03 = (Frame<webfront::networking::TCPNetworkingTS> *)sVar1._M_ptr;
  t = sVar1._M_extent._M_extent_value;
  __first = http::std::span<const_std::byte,_18446744073709551615UL>::data
                      ((span<const_std::byte,_18446744073709551615UL> *)&stack0xffffffffffffffa0);
  sVar1 = msg::MessageBase<webfront::msg::FunctionCall>::header
                    ((MessageBase<webfront::msg::FunctionCall> *)0x147092);
  this_02 = (FunctionCall *)sVar1._M_ptr;
  http::std::span<const_std::byte,_18446744073709551615UL>::size
            ((span<const_std::byte,_18446744073709551615UL> *)0x1470a9);
  http::std::span<const_std::byte,_18446744073709551615UL>::span<const_std::byte_*>
            ((span<const_std::byte,_18446744073709551615UL> *)this_01,__first,
             (size_type)in_stack_ffffffffffffff20);
  http::std::span<const_std::byte,_18446744073709551615UL>::span
            ((span<const_std::byte,_18446744073709551615UL> *)0x1470c8);
  sVar1._M_extent._M_extent_value = in_stack_ffffffffffffffb0._M_extent_value;
  sVar1._M_ptr = (pointer)t._M_extent_value;
  websocket::Frame<webfront::networking::TCPNetworkingTS>::Frame
            (this_03,in_stack_ffffffffffffffb8,sVar1);
  msg::FunctionCall::
  encodeParameter<std::__cxx11::string&,webfront::websocket::Frame<webfront::networking::TCPNetworkingTS>>
            (this_02,in_stack_ffffffffffffff88,
             (Frame<webfront::networking::TCPNetworkingTS> *)in_stack_ffffffffffffff80);
  msg::FunctionCall::
  encodeParameter<char_const(&)[12],webfront::websocket::Frame<webfront::networking::TCPNetworkingTS>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  msg::FunctionCall::
  encodeParameter<int,webfront::websocket::Frame<webfront::networking::TCPNetworkingTS>>
            ((FunctionCall *)in_stack_ffffffffffffffb0._M_extent_value,(int *)t._M_extent_value,
             this_03);
  this_00 = BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::JasmineFS>_>
            ::getLink(in_stack_ffffffffffffff20,id);
  websocket::Frame<webfront::networking::TCPNetworkingTS>::Frame
            ((Frame<webfront::networking::TCPNetworkingTS> *)this_00,
             (Frame<webfront::networking::TCPNetworkingTS> *)&stack0xffffffffffffff48);
  WebLink<webfront::networking::TCPNetworkingTS>::sendFrame
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  websocket::Frame<webfront::networking::TCPNetworkingTS>::~Frame
            ((Frame<webfront::networking::TCPNetworkingTS> *)0x147193);
  websocket::Frame<webfront::networking::TCPNetworkingTS>::~Frame
            ((Frame<webfront::networking::TCPNetworkingTS> *)0x1471a0);
  return;
}

Assistant:

void operator()(auto&&... ts) {
        command.setParametersCount(0);
        websocket::Frame<typename WebFront::Net> frame{std::span(reinterpret_cast<const std::byte*>(command.header().data()), command.header().size())};
        command.encodeParameter(name, frame);
        (((command.encodeParameter(std::forward<decltype(ts)>(ts), frame))), ...);
        
        webFront.getLink(webLinkId).sendFrame(std::move(frame));
    }